

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

unsigned_long __thiscall
bsim::quad_value_bit_vector::to_type<unsigned_long>(quad_value_bit_vector *this)

{
  byte bVar1;
  int iVar2;
  quad_value_bit_vector *in_RDI;
  int i;
  unsigned_long exp;
  unsigned_long tmp;
  quad_value_bit_vector *pqVar3;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = (quad_value_bit_vector *)0x1;
  local_1c = 0;
  while( true ) {
    iVar4 = local_1c;
    iVar2 = bitLength(in_RDI);
    if (iVar2 <= iVar4) break;
    pqVar3 = local_18;
    get(local_18,0);
    bVar1 = quad_value::binary_value((quad_value *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
    local_10 = (long)pqVar3 * (ulong)bVar1 + local_10;
    local_18 = (quad_value_bit_vector *)((long)local_18 << 1);
    local_1c = local_1c + 1;
  }
  return local_10;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }